

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator::GenerateParsingCode
          (ImmutableMessageOneofFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  Printer *printer_local;
  ImmutableMessageOneofFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldGenerator).variables_,
                     "$type$.Builder subBuilder = null;\nif ($has_oneof_case_message$) {\n  subBuilder = (($type$) $oneof_name$_).toBuilder();\n}\n"
                    );
  TVar1 = GetType((this->super_ImmutableMessageFieldGenerator).descriptor_);
  if (TVar1 == TYPE_GROUP) {
    io::Printer::Print(printer,&(this->super_ImmutableMessageFieldGenerator).variables_,
                       "$oneof_name$_ = input.readGroup($number$, $type$.$get_parser$,\n    extensionRegistry);\n"
                      );
  }
  else {
    io::Printer::Print(printer,&(this->super_ImmutableMessageFieldGenerator).variables_,
                       "$oneof_name$_ =\n    input.readMessage($type$.$get_parser$, extensionRegistry);\n"
                      );
  }
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldGenerator).variables_,
                     "if (subBuilder != null) {\n  subBuilder.mergeFrom(($type$) $oneof_name$_);\n  $oneof_name$_ = subBuilder.buildPartial();\n}\n"
                    );
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldGenerator).variables_,
                     "$set_oneof_case_message$;\n");
  return;
}

Assistant:

void ImmutableMessageOneofFieldGenerator::GenerateParsingCode(
    io::Printer* printer) const {
  printer->Print(variables_,
                 "$type$.Builder subBuilder = null;\n"
                 "if ($has_oneof_case_message$) {\n"
                 "  subBuilder = (($type$) $oneof_name$_).toBuilder();\n"
                 "}\n");

  if (GetType(descriptor_) == FieldDescriptor::TYPE_GROUP) {
    printer->Print(
        variables_,
        "$oneof_name$_ = input.readGroup($number$, $type$.$get_parser$,\n"
        "    extensionRegistry);\n");
  } else {
    printer->Print(
        variables_,
        "$oneof_name$_ =\n"
        "    input.readMessage($type$.$get_parser$, extensionRegistry);\n");
  }

  printer->Print(variables_,
                 "if (subBuilder != null) {\n"
                 "  subBuilder.mergeFrom(($type$) $oneof_name$_);\n"
                 "  $oneof_name$_ = subBuilder.buildPartial();\n"
                 "}\n");
  printer->Print(variables_, "$set_oneof_case_message$;\n");
}